

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<unsigned_long> * __thiscall
kj::_::NullableValue<unsigned_long>::operator=
          (NullableValue<unsigned_long> *this,NullableValue<unsigned_long> *other)

{
  unsigned_long *params;
  NullableValue<unsigned_long> *other_local;
  NullableValue<unsigned_long> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<unsigned_long>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<unsigned_long>(&(other->field_1).value);
      ctor<unsigned_long,unsigned_long>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }